

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

UBool isAcceptable(void *context,char *param_2,char *param_3,UDataInfo *pInfo)

{
  *(undefined4 *)context = *(undefined4 *)pInfo->formatVersion;
  if ((((((0x13 < pInfo->size) && (pInfo->isBigEndian == '\0')) && (pInfo->charsetFamily == '\0'))
       && ((pInfo->sizeofUChar == '\x02' && (pInfo->dataFormat[0] == 'R')))) &&
      ((pInfo->dataFormat[1] == 'e' &&
       ((pInfo->dataFormat[2] == 's' && (pInfo->dataFormat[3] == 'B')))))) &&
     (pInfo->formatVersion[0] != 0)) {
    return pInfo->formatVersion[0] < 4;
  }
  return '\0';
}

Assistant:

static UBool U_CALLCONV
isAcceptable(void * /*context*/,
             const char * /*type*/, const char * /*name*/,
             const UDataInfo *pInfo) {
    return (UBool)(
        pInfo->size>=20 &&
        pInfo->isBigEndian==U_IS_BIG_ENDIAN &&
        pInfo->charsetFamily==U_CHARSET_FAMILY &&
        pInfo->dataFormat[0]==0x43 &&   /* dataFormat="CvAl" */
        pInfo->dataFormat[1]==0x76 &&
        pInfo->dataFormat[2]==0x41 &&
        pInfo->dataFormat[3]==0x6c &&
        pInfo->formatVersion[0]==3);
}